

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

void xmlXPathCompAdditiveExpr(xmlXPathParserContextPtr ctxt)

{
  xmlChar xVar1;
  int ch1;
  byte *pbVar2;
  
  xmlXPathCompMultiplicativeExpr(ctxt);
  if (ctxt->error == 0) {
    pbVar2 = ctxt->cur;
    while( true ) {
      if ((0x20 < (ulong)*pbVar2) || ((0x100002600U >> ((ulong)*pbVar2 & 0x3f) & 1) == 0)) break;
      ctxt->cur = pbVar2 + 1;
      pbVar2 = pbVar2 + 1;
    }
    while( true ) {
      xVar1 = *ctxt->cur;
      if ((xVar1 != '-') && (xVar1 != '+')) break;
      ch1 = ctxt->comp->last;
      if (xVar1 != '\0') {
        ctxt->cur = ctxt->cur + 1;
      }
      pbVar2 = ctxt->cur;
      while( true ) {
        if ((0x20 < (ulong)*pbVar2) || ((0x100002600U >> ((ulong)*pbVar2 & 0x3f) & 1) == 0)) break;
        ctxt->cur = pbVar2 + 1;
        pbVar2 = pbVar2 + 1;
      }
      xmlXPathCompMultiplicativeExpr(ctxt);
      if (ctxt->error != 0) {
        return;
      }
      xmlXPathCompExprAdd(ctxt,ch1,ctxt->comp->last,XPATH_OP_PLUS,(uint)(xVar1 == '+'),0,0,
                          (void *)0x0,(void *)0x0);
      pbVar2 = ctxt->cur;
      while( true ) {
        if ((0x20 < (ulong)*pbVar2) || ((0x100002600U >> ((ulong)*pbVar2 & 0x3f) & 1) == 0)) break;
        ctxt->cur = pbVar2 + 1;
        pbVar2 = pbVar2 + 1;
      }
    }
  }
  return;
}

Assistant:

static void
xmlXPathCompAdditiveExpr(xmlXPathParserContextPtr ctxt) {

    xmlXPathCompMultiplicativeExpr(ctxt);
    CHECK_ERROR;
    SKIP_BLANKS;
    while ((CUR == '+') || (CUR == '-')) {
	int plus;
	int op1 = ctxt->comp->last;

        if (CUR == '+') plus = 1;
	else plus = 0;
	NEXT;
	SKIP_BLANKS;
        xmlXPathCompMultiplicativeExpr(ctxt);
	CHECK_ERROR;
	PUSH_BINARY_EXPR(XPATH_OP_PLUS, op1, ctxt->comp->last, plus, 0);
	SKIP_BLANKS;
    }
}